

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

qpdf_oh new_object(qpdf_data qpdf,QPDFObjectHandle *qoh)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  QPDFObjectHandle *pQVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  mapped_type *pmVar3;
  qpdf_oh oh;
  undefined1 local_2d;
  qpdf_oh local_2c;
  QPDFObjectHandle *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  local_2c = qpdf->next_oh + 1;
  qpdf->next_oh = local_2c;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<QPDFObjectHandle,std::allocator<QPDFObjectHandle>,QPDFObjectHandle_const&>
            (a_Stack_20,&local_28,(allocator<QPDFObjectHandle> *)&local_2d,qoh);
  pmVar3 = std::
           map<unsigned_int,_std::shared_ptr<QPDFObjectHandle>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<QPDFObjectHandle>_>_>_>
           ::operator[](&qpdf->oh_cache,&local_2c);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pQVar1 = local_28;
  local_28 = (QPDFObjectHandle *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (pmVar3->super___shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
  (pmVar3->super___shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = pQVar1;
  (pmVar3->super___shared_ptr<QPDFObjectHandle,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var2._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return local_2c;
}

Assistant:

static qpdf_oh
new_object(qpdf_data qpdf, QPDFObjectHandle const& qoh)
{
    qpdf_oh oh = ++qpdf->next_oh; // never return 0
    qpdf->oh_cache[oh] = std::make_shared<QPDFObjectHandle>(qoh);
    return oh;
}